

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::setupWeights(SPxSteepPR<double> *this,Type type)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Verbosity VVar5;
  double *pdVar6;
  SPxBasisBase<double> *x;
  SPxBasisBase<double> *this_00;
  int in_ESI;
  long in_RDI;
  double dVar7;
  SSVectorBase<double> tmp;
  Verbosity old_verbosity;
  VectorBase<double> *coWeights;
  VectorBase<double> *weights;
  int endCoDim;
  int endDim;
  int i;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffed8;
  SPxSolverBase<double> *in_stack_fffffffffffffee0;
  SVectorBase<double> *in_stack_fffffffffffffef0;
  byte local_105;
  shared_ptr<soplex::Tolerances> *tol;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 uVar8;
  int in_stack_ffffffffffffff0c;
  VectorBase<double> *in_stack_ffffffffffffff10;
  SSVectorBase<double> *this_01;
  SSVectorBase<double> local_90;
  undefined4 local_30;
  Verbosity local_2c;
  shared_ptr<soplex::Tolerances> *local_28;
  long local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = 0;
  local_18 = 0;
  local_20 = *(long *)(in_RDI + 0x10) + 0x8b0;
  local_28 = (shared_ptr<soplex::Tolerances> *)(*(long *)(in_RDI + 0x10) + 0x8c8);
  if (*(int *)(in_RDI + 0x150) == 1) {
    if (in_ESI == -1) {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x8e0) & 1) != 0) {
        iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x2e5dc3);
        iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5dda);
        if (iVar3 < iVar4) {
          local_14 = VectorBase<double>::dim((VectorBase<double> *)0x2e5df1);
        }
        else {
          local_14 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5e0b);
        }
        iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x2e5e1f);
        iVar4 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e5e36);
        if (iVar3 < iVar4) {
          local_18 = VectorBase<double>::dim((VectorBase<double> *)0x2e5e4d);
        }
        else {
          local_18 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e5e67);
        }
      }
      SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5e8e);
      VectorBase<double>::reDim
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
      local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5ead);
      while( true ) {
        local_10 = local_10 + -1;
        uVar8 = (undefined1)((uint)in_stack_ffffffffffffff08 >> 0x18);
        if (local_10 < local_14) break;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffee0,
                            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        *pdVar6 = 2.0;
      }
      SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e5f18);
      VectorBase<double>::reDim(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(bool)uVar8);
      local_10 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e5f37);
      while (local_10 = local_10 + -1, local_18 <= local_10) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffee0,
                            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        *pdVar6 = 1.0;
      }
    }
    else {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x8e0) & 1) != 0) {
        iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x2e5fab);
        iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5fc2);
        if (iVar3 < iVar4) {
          local_14 = VectorBase<double>::dim((VectorBase<double> *)0x2e5fd9);
        }
        else {
          local_14 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e5ff3);
        }
      }
      uVar8 = (undefined1)((uint)in_stack_ffffffffffffff08 >> 0x18);
      SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e601a);
      VectorBase<double>::reDim(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(bool)uVar8);
      local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e6039);
      while (local_10 = local_10 + -1, local_14 <= local_10) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffee0,
                            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        *pdVar6 = 1.0;
      }
    }
  }
  else {
    local_c = in_ESI;
    if ((*(long *)(*(long *)(in_RDI + 0x10) + 0x918) != 0) &&
       (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x918)), 2 < (int)VVar5
       )) {
      local_2c = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x918));
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x918);
      local_30 = 3;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_30);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffee0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffed8);
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x918);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_2c);
    }
    if (local_c == -1) {
      SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e6198);
      VectorBase<double>::reDim
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
      local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e61b7);
      while( true ) {
        local_10 = local_10 + -1;
        uVar8 = (undefined1)((uint)in_stack_ffffffffffffff08 >> 0x18);
        if (local_10 < local_14) break;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffee0,
                            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        *pdVar6 = 1.0;
      }
      SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e6222);
      VectorBase<double>::reDim(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,(bool)uVar8);
      local_10 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e6241);
      while (local_10 = local_10 + -1, local_18 <= local_10) {
        SPxSolverBase<double>::vector
                  (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        dVar7 = SVectorBase<double>::length2(in_stack_fffffffffffffef0);
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffee0,
                            (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        *pdVar6 = dVar7 + 1.0;
      }
    }
    else {
      tol = local_28;
      SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e62e4);
      VectorBase<double>::reDim
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
      iVar3 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e6303);
      SPxSolverBase<double>::tolerances(*(SPxSolverBase<double> **)(in_RDI + 0x10));
      this_01 = &local_90;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
      SSVectorBase<double>::SSVectorBase(this_01,iVar3,tol);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2e6354);
      local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e6365);
      while( true ) {
        iVar4 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        local_10 = local_10 + -1;
        local_105 = 0;
        if (local_14 <= local_10) {
          bVar2 = SPxSolverBase<double>::isTimeLimitReached
                            ((SPxSolverBase<double> *)CONCAT44(iVar3,in_stack_ffffffffffffff08),
                             SUB81((ulong)tol >> 0x38,0));
          local_105 = bVar2 ^ 0xff;
        }
        if ((local_105 & 1) == 0) break;
        x = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
        this_00 = (SPxBasisBase<double> *)
                  SPxSolverBase<double>::unitVector(in_stack_fffffffffffffee0,iVar4);
        SPxBasisBase<double>::coSolve
                  (this_00,(SSVectorBase<double> *)x,
                   (SVectorBase<double> *)in_stack_fffffffffffffee0);
        in_stack_fffffffffffffee0 =
             (SPxSolverBase<double> *)SSVectorBase<double>::length2((SSVectorBase<double> *)this_00)
        ;
        in_stack_fffffffffffffed8 =
             (shared_ptr<soplex::Tolerances> *)
             VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffee0,iVar4);
        (in_stack_fffffffffffffed8->
        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)in_stack_fffffffffffffee0;
      }
      SSVectorBase<double>::~SSVectorBase((SSVectorBase<double> *)in_stack_fffffffffffffee0);
    }
  }
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x8e0) = 1;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}